

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMemoryAllocatorTest.cpp
# Opt level: O1

Utest * __thiscall
TEST_TestMemoryAccountant_countAllocationsPerSizeMultipleAllocations_TestShell::createTest
          (TEST_TestMemoryAccountant_countAllocationsPerSizeMultipleAllocations_TestShell *this)

{
  TEST_TestMemoryAccountant_countAllocationsPerSizeMultipleAllocations_Test *this_00;
  
  this_00 = (TEST_TestMemoryAccountant_countAllocationsPerSizeMultipleAllocations_Test *)
            operator_new(0x68,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestMemoryAllocatorTest.cpp"
                         ,0x17d);
  TEST_TestMemoryAccountant_countAllocationsPerSizeMultipleAllocations_Test::
  TEST_TestMemoryAccountant_countAllocationsPerSizeMultipleAllocations_Test(this_00);
  return (Utest *)this_00;
}

Assistant:

TEST(TestMemoryAccountant, countAllocationsPerSizeMultipleAllocations)
{
    accountant.alloc(4);
    accountant.alloc(4);
    accountant.alloc(8);
    LONGS_EQUAL(2, accountant.totalAllocationsOfSize(4));
    LONGS_EQUAL(1, accountant.totalAllocationsOfSize(8));
    LONGS_EQUAL(0, accountant.totalAllocationsOfSize(10));
    LONGS_EQUAL(3, accountant.totalAllocations());
}